

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_file_get_comment.c
# Opt level: O3

char * zip_file_get_comment(zip_t *za,zip_uint64_t idx,zip_uint32_t *lenp,zip_flags_t flags)

{
  undefined8 in_RAX;
  zip_dirent_t *pzVar1;
  zip_uint8_t *pzVar2;
  zip_uint32_t len;
  zip_uint32_t local_24;
  
  local_24 = (zip_uint32_t)((ulong)in_RAX >> 0x20);
  pzVar2 = (zip_uint8_t *)0x0;
  pzVar1 = _zip_get_dirent(za,idx,flags,(zip_error_t *)0x0);
  if (pzVar1 != (zip_dirent_t *)0x0) {
    pzVar2 = _zip_string_get(pzVar1->comment,&local_24,flags,&za->error);
    if (pzVar2 == (zip_uint8_t *)0x0) {
      pzVar2 = (zip_uint8_t *)0x0;
    }
    else if (lenp != (zip_uint32_t *)0x0) {
      *lenp = local_24;
    }
  }
  return (char *)pzVar2;
}

Assistant:

ZIP_EXTERN const char *
zip_file_get_comment(zip_t *za, zip_uint64_t idx, zip_uint32_t *lenp, zip_flags_t flags) {
    zip_dirent_t *de;
    zip_uint32_t len;
    const zip_uint8_t *str;

    if ((de = _zip_get_dirent(za, idx, flags, NULL)) == NULL)
	return NULL;

    if ((str = _zip_string_get(de->comment, &len, flags, &za->error)) == NULL)
	return NULL;

    if (lenp)
	*lenp = len;

    return (const char *)str;
}